

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<unsigned_int,unsigned_int,unsigned_int,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool>
               (uint *ldata,uint *rdata,uint *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  unsigned_long *puVar4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  uint uVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  ulong uVar12;
  idx_t idx_in_entry;
  ulong uVar13;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  idx_t local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  
  local_48 = ldata;
  local_40 = rdata;
  local_38 = result_data;
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
      uVar13 = 0;
      do {
        uVar9 = uVar13;
        if (psVar1 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar1[uVar13];
        }
        uVar12 = uVar13;
        if (psVar2 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar2[uVar13];
        }
        uVar8 = ldata[uVar9];
        if (rdata[uVar12] == 0) {
          _Var11._M_head_impl =
               (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_58);
            p_Var7 = p_Stack_60;
            peVar6 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_50);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var11._M_head_impl;
            rdata = local_40;
            ldata = local_48;
            result_data = local_38;
          }
          bVar5 = (byte)uVar13 & 0x3f;
          _Var11._M_head_impl[uVar13 >> 6] =
               _Var11._M_head_impl[uVar13 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          uVar8 = uVar8 / rdata[uVar12];
        }
        result_data[uVar13] = uVar8;
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar13 = 0;
    do {
      uVar9 = uVar13;
      if (psVar1 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar1[uVar13];
      }
      uVar12 = uVar13;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar13];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) &&
         ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)))) {
        uVar8 = ldata[uVar9];
        if (rdata[uVar12] == 0) {
          _Var11._M_head_impl =
               (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_58);
            p_Var7 = p_Stack_60;
            peVar6 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_50);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 _Var11._M_head_impl;
            rdata = local_40;
            ldata = local_48;
            result_data = local_38;
          }
          bVar5 = (byte)uVar13 & 0x3f;
          _Var11._M_head_impl[uVar13 >> 6] =
               _Var11._M_head_impl[uVar13 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          uVar8 = uVar8 / rdata[uVar12];
        }
        result_data[uVar13] = uVar8;
      }
      else {
        _Var11._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_58 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_58);
          p_Var7 = p_Stack_60;
          peVar6 = local_68;
          local_68 = (element_type *)0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var3 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar6;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
             p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_50);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var11._M_head_impl;
          rdata = local_40;
          ldata = local_48;
          result_data = local_38;
        }
        bVar5 = (byte)uVar13 & 0x3f;
        _Var11._M_head_impl[uVar13 >> 6] =
             _Var11._M_head_impl[uVar13 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5)
        ;
      }
      uVar13 = uVar13 + 1;
    } while (count != uVar13);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}